

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  uint in_EDX;
  Byte *in_RSI;
  undefined8 *in_RDI;
  SizeT mask;
  UInt32 dictSize;
  int __result___1;
  int __result__;
  SizeT dicBufSize;
  CLzmaProps propNew;
  ISzAlloc *in_stack_ffffffffffffffa8;
  ISzAlloc *alloc_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  UInt32 UVar2;
  uint in_stack_ffffffffffffffb8;
  ulong local_40;
  CLzmaProps local_38;
  undefined8 *local_28;
  undefined8 *local_10;
  SRes local_4;
  
  local_28 = in_RCX;
  local_10 = in_RDI;
  local_4 = LzmaProps_Decode(&local_38,in_RSI,in_EDX);
  if ((local_4 == 0) &&
     (local_4 = LzmaDec_AllocateProbs2
                          ((CLzmaDec *)(ulong)in_stack_ffffffffffffffb8,
                           (CLzmaProps *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8), local_4 == 0)) {
    alloc_00 = (ISzAlloc *)0xfff;
    if (local_38.dicSize < 0x40000000) {
      if (0x3fffff < local_38.dicSize) {
        alloc_00 = (ISzAlloc *)0xfffff;
      }
    }
    else {
      alloc_00 = (ISzAlloc *)0x3fffff;
    }
    local_40 = (long)&alloc_00->Alloc + (ulong)local_38.dicSize &
               ((ulong)alloc_00 ^ 0xffffffffffffffff);
    if (local_40 < local_38.dicSize) {
      local_40 = (ulong)local_38.dicSize;
    }
    if ((local_10[3] == 0) || (local_40 != local_10[7])) {
      UVar2 = local_38.dicSize;
      LzmaDec_FreeDict((CLzmaDec *)CONCAT44(local_38.dicSize,in_stack_ffffffffffffffb0),alloc_00);
      uVar1 = (*(code *)*local_28)(local_28,local_40);
      local_10[3] = uVar1;
      if (local_10[3] == 0) {
        LzmaDec_FreeProbs((CLzmaDec *)CONCAT44(UVar2,in_stack_ffffffffffffffb0),alloc_00);
        return 2;
      }
    }
    local_10[7] = local_40;
    *local_10 = local_38._0_8_;
    local_10[1] = CONCAT44(local_38.dicSize,local_38.pb);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));

  {
    UInt32 dictSize = propNew.dicSize;
    SizeT mask = ((UInt32)1 << 12) - 1;
         if (dictSize >= ((UInt32)1 << 30)) mask = ((UInt32)1 << 22) - 1;
    else if (dictSize >= ((UInt32)1 << 22)) mask = ((UInt32)1 << 20) - 1;;
    dicBufSize = ((SizeT)dictSize + mask) & ~mask;
    if (dicBufSize < dictSize)
      dicBufSize = dictSize;
  }

  if (!p->dic || dicBufSize != p->dicBufSize)
  {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte *)alloc->Alloc(alloc, dicBufSize);
    if (!p->dic)
    {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}